

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTzType>::resize(QList<QTzType> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QTzType> *in_RSI;
  QArrayDataPointer<QTzType> *in_RDI;
  QList<QTzType> *unaff_retaddr;
  QArrayDataPointer<QTzType> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QTzType>::size((QList<QTzType> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QTzType>::operator->(in_RDI);
    QArrayDataPointer<QTzType>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }